

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserUtils.h
# Opt level: O2

bool ODDLParser::isFloat<char>(char *in,char *end)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  
  if (in != end) {
    in = in + (*in == '-');
  }
  bVar3 = false;
  do {
    bVar2 = isNotEndOfToken<char>(in,end);
    cVar1 = *in;
    if (!bVar2) {
      if (cVar1 == '.') {
LAB_0058d647:
        do {
          in = in + 1;
          bVar2 = isNotEndOfToken<char>(in,end);
          if (!bVar2) {
            return bVar3;
          }
          bVar3 = true;
        } while ((byte)(*in - 0x30U) < 10);
      }
      return false;
    }
    if (cVar1 == '.') {
      bVar3 = true;
      goto LAB_0058d647;
    }
    if (9 < (byte)(cVar1 - 0x30U)) {
      return false;
    }
    in = in + 1;
    bVar3 = true;
  } while( true );
}

Assistant:

inline
bool isFloat( T *in, T *end ) {
    if( in != end ) {
        if( *in == '-' ) {
            ++in;
        }
    }

    // check for <1>.0f
    bool result( false );
    while( isNotEndOfToken( in, end ) ) {
        if( *in == '.' ) {
            result = true;
            break;
        }
        result = isNumeric( *in );
        if( !result ) {
            return false;
        }
        ++in;
    }

    // check for 1<.>0f
    if( *in == '.' ) {
        ++in;
    } else {
        return false;
    }

    // check for 1.<0>f
    while( isNotEndOfToken( in, end ) ) {
        result = isNumeric( *in );
        if( !result ) {
            return false;
        }
        ++in;
    }

    return result;
}